

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  byte bVar1;
  ushort uVar2;
  st_ptls_on_extension_t *psVar3;
  st_ptls_verify_certificate_t *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ushort uVar9;
  ushort *puVar10;
  ulong uVar11;
  ushort *puVar12;
  ushort *puVar13;
  bool bVar14;
  ptls_iovec_t pVar15;
  ptls_iovec_t certs [16];
  byte local_158 [8];
  ushort *local_150;
  ulong local_148;
  uint *local_140;
  ptls_iovec_t local_138 [16];
  
  uVar6 = 0x32;
  if (end == src) {
    uVar7 = 0;
  }
  else {
    bVar1 = *src;
    src = src + 1;
    uVar7 = 0;
    if ((ulong)bVar1 <= (ulong)((long)end - (long)src)) {
      uVar6 = 0x2f;
      if (bVar1 == 0) {
        uVar6 = uVar7;
      }
      uVar7 = (uint)(bVar1 == 0);
    }
  }
  if ((char)uVar7 == '\0') {
    return uVar6;
  }
  uVar7 = 0x32;
  if (2 < (ulong)((long)end - (long)src)) {
    lVar8 = 0;
    pVar15.len = 0;
    do {
      pVar15.len = (ulong)*(byte *)((long)src + lVar8) | pVar15.len << 8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    src = (uint8_t *)((long)src + 3);
    if (pVar15.len <= (ulong)((long)end - (long)src)) {
      local_140 = (uint *)got_certs;
      puVar10 = (ushort *)(pVar15.len + (long)src);
      pVar15.len = 0;
      local_150 = (ushort *)end;
      uVar7 = uVar6;
      do {
        if ((ushort *)src == puVar10) {
          iVar5 = 0;
          break;
        }
        iVar5 = 4;
        puVar13 = (ushort *)src;
        if ((ulong)((long)puVar10 - (long)src) < 3) {
LAB_0011aba0:
          bVar14 = false;
          uVar7 = 0x32;
        }
        else {
          lVar8 = 0;
          uVar11 = 0;
          do {
            uVar11 = (ulong)*(byte *)((long)src + lVar8) | uVar11 << 8;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          puVar12 = (ushort *)((long)src + 3);
          puVar13 = puVar12;
          if ((ulong)((long)puVar10 - (long)puVar12) < uVar11) goto LAB_0011aba0;
          puVar13 = (ushort *)((long)puVar12 + uVar11);
          bVar14 = true;
          if (pVar15.len < 0x10) {
            local_138[pVar15.len].base = (uint8_t *)puVar12;
            local_138[pVar15.len].len = uVar11;
            iVar5 = 0;
            pVar15.len = pVar15.len + 1;
          }
          else {
            iVar5 = 0;
          }
        }
        src = (uint8_t *)puVar13;
        if (!bVar14) break;
        local_158[0] = 1;
        local_158[1] = 0x24;
        local_158[2] = 1;
        local_158[3] = 0;
        local_158[4] = 0;
        local_158[5] = 0x3e;
        local_158[6] = 8;
        local_158[7] = 0;
        iVar5 = 4;
        uVar6 = 0x32;
        if (1 < (ulong)((long)puVar10 - (long)puVar13)) {
          lVar8 = 0;
          uVar11 = 0;
          do {
            uVar11 = (ulong)*(byte *)((long)puVar13 + lVar8) | uVar11 << 8;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 2);
          src = (uint8_t *)(puVar13 + 1);
          if (uVar11 <= (ulong)((long)puVar10 - (long)src)) {
            if (uVar11 == 0) {
              iVar5 = 0;
              uVar6 = uVar7;
            }
            else {
              local_148 = pVar15.len;
              puVar13 = (ushort *)((long)puVar13 + uVar11 + 2);
              puVar12 = (ushort *)src;
              do {
                uVar6 = 0x32;
                src = (uint8_t *)puVar12;
                if ((long)puVar13 - (long)puVar12 < 2) {
LAB_0011ad8f:
                  iVar5 = 4;
                  end = (uint8_t *)local_150;
                  pVar15.len = local_148;
                  goto LAB_0011ad9f;
                }
                uVar2 = *puVar12;
                uVar9 = uVar2 << 8 | uVar2 >> 8;
                src = (uint8_t *)(puVar12 + 1);
                if (uVar9 < 0x40) {
                  if ((local_158[uVar9 >> 3] >> (uVar9 & 7) & 1) != 0) {
                    uVar6 = 0x2f;
                    goto LAB_0011ad8f;
                  }
                  if (uVar9 < 0x40) {
                    local_158[uVar9 >> 3] =
                         local_158[uVar9 >> 3] | (byte)(1 << ((byte)(uVar2 >> 8) & 7));
                  }
                }
                uVar6 = 0x32;
                iVar5 = 4;
                if (1 < (ulong)((long)puVar13 - (long)src)) {
                  lVar8 = 0;
                  pVar15.len = 0;
                  do {
                    pVar15.len = (ulong)*(byte *)((long)src + lVar8) | pVar15.len << 8;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 2);
                  src = (uint8_t *)(puVar12 + 2);
                  if (pVar15.len <= (ulong)((long)puVar13 - (long)src)) {
                    psVar3 = tls->ctx->on_extension;
                    if (psVar3 == (st_ptls_on_extension_t *)0x0) {
                      iVar5 = 0;
                      uVar6 = 0;
                      src = (uint8_t *)((long)src + pVar15.len);
                    }
                    else {
                      pVar15.base = src;
                      iVar5 = (*psVar3->cb)(psVar3,tls,'\v',uVar9,pVar15);
                      uVar6 = (uint)(iVar5 != 0);
                      puVar12 = (ushort *)((long)src + pVar15.len);
                      if (iVar5 != 0) {
                        puVar12 = (ushort *)src;
                      }
                      iVar5 = uVar6 * 4;
                      src = (uint8_t *)puVar12;
                    }
                  }
                }
                end = (uint8_t *)local_150;
                pVar15.len = local_148;
                if (iVar5 != 0) goto LAB_0011ad9f;
                puVar12 = (ushort *)src;
              } while ((ushort *)src != puVar13);
              iVar5 = 0;
            }
          }
        }
LAB_0011ad9f:
        uVar7 = uVar6;
      } while (iVar5 == 0);
      bVar14 = iVar5 == 0;
      got_certs = (int *)local_140;
      goto LAB_0011adbe;
    }
  }
  bVar14 = false;
  pVar15.len = 0;
LAB_0011adbe:
  uVar6 = uVar7;
  if ((bVar14) && (uVar6 = 0x32, src == end)) {
    uVar6 = uVar7;
    if ((pVar15.len != 0) &&
       (psVar4 = tls->ctx->verify_certificate, psVar4 != (st_ptls_verify_certificate_t *)0x0)) {
      iVar5 = (*psVar4->cb)(psVar4,tls,&(tls->certificate_verify).cb,
                            &(tls->certificate_verify).verify_ctx,local_138,pVar15.len);
      if (iVar5 != 0) {
        return iVar5;
      }
      uVar6 = 0;
    }
    *got_certs = (uint)(pVar15.len != 0);
  }
  return uVar6;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < sizeof(certs) / sizeof(certs[0]))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (num_certs != 0 && tls->ctx->verify_certificate != NULL) {
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}